

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O3

void __thiscall OpenMD::SimInfo::setSnapshotManager(SimInfo *this,SnapshotManager *sman)

{
  SnapshotManager *pSVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  
  pSVar1 = this->sman_;
  if (pSVar1 != sman) {
    if (pSVar1 != (SnapshotManager *)0x0) {
      (*pSVar1->_vptr_SnapshotManager[1])();
    }
    this->sman_ = sman;
    for (p_Var4 = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        ((_Rb_tree_header *)p_Var4 != &(this->molecules_)._M_t._M_impl.super__Rb_tree_header &&
        (p_Var2 = p_Var4[1]._M_parent, p_Var2 != (_Base_ptr)0x0));
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      p_Var5 = p_Var2->_M_left;
      if (p_Var5 != p_Var2->_M_right) {
        p_Var3 = *(_Base_ptr *)p_Var5;
        while (p_Var3 != (_Base_ptr)0x0) {
          p_Var5 = (_Base_ptr)&p_Var5->_M_parent;
          p_Var3->_M_right = (_Base_ptr)sman;
          if (p_Var5 == p_Var2->_M_right) break;
          p_Var3 = *(_Base_ptr *)p_Var5;
        }
      }
      p_Var5 = p_Var2[4]._M_parent;
      if (p_Var5 != p_Var2[4]._M_left) {
        p_Var3 = *(_Base_ptr *)p_Var5;
        while (p_Var3 != (_Base_ptr)0x0) {
          p_Var5 = (_Base_ptr)&p_Var5->_M_parent;
          p_Var3->_M_right = (_Base_ptr)sman;
          if (p_Var5 == p_Var2[4]._M_left) break;
          p_Var3 = *(_Base_ptr *)p_Var5;
        }
      }
      p_Var5 = p_Var2[5]._M_right;
      if (p_Var5 != *(_Base_ptr *)(p_Var2 + 6)) {
        p_Var3 = *(_Base_ptr *)p_Var5;
        while (p_Var3 != (_Base_ptr)0x0) {
          p_Var5 = (_Base_ptr)&p_Var5->_M_parent;
          p_Var3[1]._M_right = (_Base_ptr)sman;
          if (p_Var5 == (_Base_ptr)*(undefined1 **)(p_Var2 + 6)) break;
          p_Var3 = *(_Base_ptr *)p_Var5;
        }
      }
      p_Var5 = p_Var2[1]._M_parent;
      if (p_Var5 != p_Var2[1]._M_left) {
        p_Var3 = *(_Base_ptr *)p_Var5;
        while (p_Var3 != (_Base_ptr)0x0) {
          p_Var5 = (_Base_ptr)&p_Var5->_M_parent;
          p_Var3->_M_parent = (_Base_ptr)sman;
          if (p_Var5 == p_Var2[1]._M_left) break;
          p_Var3 = *(_Base_ptr *)p_Var5;
        }
      }
      p_Var5 = *(_Base_ptr *)(p_Var2 + 2);
      if (p_Var5 != p_Var2[2]._M_parent) {
        p_Var3 = *(_Base_ptr *)p_Var5;
        while (p_Var3 != (_Base_ptr)0x0) {
          p_Var5 = (_Base_ptr)&p_Var5->_M_parent;
          p_Var3->_M_parent = (_Base_ptr)sman;
          if (p_Var5 == p_Var2[2]._M_parent) break;
          p_Var3 = *(_Base_ptr *)p_Var5;
        }
      }
      p_Var5 = p_Var2[2]._M_right;
      if (p_Var5 != *(_Base_ptr *)(p_Var2 + 3)) {
        p_Var3 = *(_Base_ptr *)p_Var5;
        while (p_Var3 != (_Base_ptr)0x0) {
          p_Var5 = (_Base_ptr)&p_Var5->_M_parent;
          p_Var3->_M_parent = (_Base_ptr)sman;
          if (p_Var5 == (_Base_ptr)*(undefined1 **)(p_Var2 + 3)) break;
          p_Var3 = *(_Base_ptr *)p_Var5;
        }
      }
      p_Var5 = p_Var2[3]._M_left;
      if (p_Var5 != p_Var2[3]._M_right) {
        p_Var3 = *(_Base_ptr *)p_Var5;
        while (p_Var3 != (_Base_ptr)0x0) {
          p_Var5 = (_Base_ptr)&p_Var5->_M_parent;
          p_Var3->_M_parent = (_Base_ptr)sman;
          if (p_Var5 == p_Var2[3]._M_right) break;
          p_Var3 = *(_Base_ptr *)p_Var5;
        }
      }
    }
  }
  return;
}

Assistant:

void SimInfo::setSnapshotManager(SnapshotManager* sman) {
    if (sman_ == sman) { return; }
    delete sman_;
    sman_ = sman;

    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::CutoffGroupIterator cgIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    CutoffGroup* cg;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        atom->setSnapshotManager(sman_);
      }
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        rb->setSnapshotManager(sman_);
      }
      for (cg = mol->beginCutoffGroup(cgIter); cg != NULL;
           cg = mol->nextCutoffGroup(cgIter)) {
        cg->setSnapshotManager(sman_);
      }
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        bond->setSnapshotManager(sman_);
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        bend->setSnapshotManager(sman_);
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        torsion->setSnapshotManager(sman_);
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        inversion->setSnapshotManager(sman_);
      }
    }
  }